

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlAttrPtr xmlNewDocProp(xmlDocPtr doc,xmlChar *name,xmlChar *value)

{
  int iVar1;
  xmlNodePtr node;
  xmlChar *pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  
  if ((name != (xmlChar *)0x0) && (node = (xmlNodePtr)(*xmlMalloc)(0x68), node != (xmlNodePtr)0x0))
  {
    node->_private = (void *)0x0;
    *(undefined8 *)&node->type = 0;
    node->content = (xmlChar *)0x0;
    node->properties = (_xmlAttr *)0x0;
    node->doc = (_xmlDoc *)0x0;
    node->ns = (xmlNs *)0x0;
    node->next = (_xmlNode *)0x0;
    node->prev = (_xmlNode *)0x0;
    node->nsDef = (xmlNs *)0x0;
    node->last = (_xmlNode *)0x0;
    node->parent = (_xmlNode *)0x0;
    node->name = (xmlChar *)0x0;
    node->children = (_xmlNode *)0x0;
    node->type = XML_ATTRIBUTE_NODE;
    if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
      pxVar2 = xmlStrdup(name);
    }
    else {
      pxVar2 = xmlDictLookup(doc->dict,name,-1);
    }
    node->name = pxVar2;
    if ((pxVar2 != (xmlChar *)0x0) &&
       ((node->doc = doc, value == (xmlChar *)0x0 ||
        (iVar1 = xmlNodeParseContent(node,value,-1), -1 < iVar1)))) {
      if (xmlRegisterCallbacks == 0) {
        return (xmlAttrPtr)node;
      }
      pp_Var3 = __xmlRegisterNodeDefaultValue();
      if (*pp_Var3 == (xmlRegisterNodeFunc)0x0) {
        return (xmlAttrPtr)node;
      }
      pp_Var3 = __xmlRegisterNodeDefaultValue();
      (**pp_Var3)(node);
      return (xmlAttrPtr)node;
    }
    xmlFreeProp((xmlAttrPtr)node);
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

xmlAttrPtr
xmlNewDocProp(xmlDocPtr doc, const xmlChar *name, const xmlChar *value) {
    xmlAttrPtr cur;

    if (name == NULL) {
	return(NULL);
    }

    /*
     * Allocate a new property and fill the fields.
     */
    cur = (xmlAttrPtr) xmlMalloc(sizeof(xmlAttr));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlAttr));
    cur->type = XML_ATTRIBUTE_NODE;

    if ((doc != NULL) && (doc->dict != NULL))
	cur->name = xmlDictLookup(doc->dict, name, -1);
    else
	cur->name = xmlStrdup(name);
    if (cur->name == NULL)
        goto error;
    cur->doc = doc;
    if (value != NULL) {
	if (xmlNodeParseContent((xmlNodePtr) cur, value, -1) < 0)
            goto error;
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);

error:
    xmlFreeProp(cur);
    return(NULL);
}